

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__get16be(stbi__context *s)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  return (uint)CONCAT11(sVar1,sVar2);
}

Assistant:

static int stbi__get16be(stbi__context* s)
{
    int z = stbi__get8(s);
    return (z << 8) + stbi__get8(s);
}